

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_attr.cpp
# Opt level: O2

void testAttrFloatVectors(string *tempdir)

{
  int iVar1;
  exr_result_t eVar2;
  exr_context_t ctxt;
  ostream *poVar3;
  char *pcVar4;
  char *in_RCX;
  char *pcVar5;
  _internal_exr_context *pctxt;
  exr_attr_float_vector_t local_48;
  float local_38 [6];
  exr_context_t f;
  
  ctxt = createDummyFile("<floatvector>");
  local_38[0] = 1.0;
  local_38[1] = 2.0;
  local_38[2] = 3.0;
  local_38[3] = 4.0;
  f = ctxt;
  if (ctxt == (exr_context_t)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = (**(code **)(ctxt + 0x40))
                      (ctxt,3,"Invalid reference to float vector object to initialize");
    if (iVar1 == 3) {
      pcVar5 = (char *)0xfffffffffffffffc;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_init (f, &fv, -4)",(char *)0x1cf,0x1523e2,pcVar5);
      }
      iVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid (NULL) arguments to float vector create");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_create (f, __null, fdata, 4)",(char *)0x1d2,0x1523e2,
                       pcVar5);
      }
      iVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid (NULL) arguments to float vector create");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_create (f, &fv, __null, 4)",(char *)0x1d5,0x1523e2,
                       pcVar5);
      }
      pcVar5 = (char *)0xfffffffffffffffc;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, -4)",(char *)0x1d8,0x1523e2,
                       pcVar5);
      }
      pcVar5 = (char *)0x3fffffff;
      eVar2 = exr_attr_float_vector_create(ctxt,&local_48,local_38,0x3fffffff);
      if (eVar2 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, (2147483647) / 2)",
                       (char *)0x1de,0x1523e2,pcVar5);
      }
      iVar1 = (**(code **)(ctxt + 0x40))
                        (ctxt,3,"Invalid reference to float vector object to initialize");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_init_static (f, __null, fdata, 4)",(char *)0x1e1,
                       0x1523e2,pcVar5);
      }
      iVar1 = (**(code **)(ctxt + 0x40))
                        (ctxt,3,"Invalid reference to float array object to initialize");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_init_static (f, &fv, __null, 4)",(char *)0x1e4,
                       0x1523e2,pcVar5);
      }
      pcVar5 = (char *)0xfffffffffffffffc;
      iVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,
                         "Received request to allocate negative sized float vector (%d entries)");
      if (iVar1 != 3) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(iVar1);
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"\n    expected: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(3);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_init_static (f, &fv, fdata, -4)",(char *)0x1e7,
                       0x1523e2,pcVar5);
      }
      eVar2 = exr_attr_float_vector_init(ctxt,&local_48,4);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_init (f, &fv, 4)",(char *)0x1ee,0x1523e2,pcVar5);
      }
      if (local_48.length != 4) {
        core_test_fail("fv.length == 4",(char *)0x1ef,0x1523e2,pcVar5);
      }
      if (local_48.alloc_size != 4) {
        core_test_fail("fv.alloc_size == 4",(char *)0x1f0,0x1523e2,pcVar5);
      }
      if (local_48.arr == (float *)0x0) {
        core_test_fail("fv.arr != __null",(char *)0x1f1,0x1523e2,pcVar5);
      }
      (**(code **)(ctxt + 0x60))();
      local_48.length = 0;
      local_48.alloc_size = 0;
      local_48.arr = (float *)0x0;
      pcVar5 = (char *)0x4;
      eVar2 = exr_attr_float_vector_create(ctxt,&local_48,local_38,4);
      if (eVar2 != 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
        poVar3 = std::operator<<(poVar3,") ");
        pcVar4 = (char *)exr_get_default_error_message(eVar2);
        poVar3 = std::operator<<(poVar3,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar3);
        core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x1f7,0x1523e2,
                       pcVar5);
      }
      if (local_48.length != 4) {
        core_test_fail("fv.length == 4",(char *)0x1f8,0x1523e2,pcVar5);
      }
      if (local_48.alloc_size != 4) {
        core_test_fail("fv.alloc_size == 4",(char *)0x1f9,0x1523e2,pcVar5);
      }
      if ((*local_48.arr == 1.0) && (!NAN(*local_48.arr))) {
        if ((local_48.arr[1] != 2.0) || (NAN(local_48.arr[1]))) {
          core_test_fail("fv.arr[1] == 2.f",(char *)0x1fb,0x1523e2,pcVar5);
        }
        if ((local_48.arr[2] != 3.0) || (NAN(local_48.arr[2]))) {
          core_test_fail("fv.arr[2] == 3.f",(char *)0x1fc,0x1523e2,pcVar5);
        }
        if ((local_48.arr[3] == 4.0) && (!NAN(local_48.arr[3]))) {
          (**(code **)(ctxt + 0x60))();
          local_48.length = 0;
          local_48.alloc_size = 0;
          local_48.arr = (float *)0x0;
          s_malloc_fail_on = 1;
          pcVar5 = (char *)0x4;
          eVar2 = exr_attr_float_vector_create(ctxt,&local_48,local_38,4);
          s_malloc_fail_on = 0;
          if (eVar2 != 1) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,eVar2);
            poVar3 = std::operator<<(poVar3,") ");
            pcVar4 = (char *)exr_get_default_error_message(eVar2);
            poVar3 = std::operator<<(poVar3,pcVar4);
            poVar3 = std::operator<<(poVar3,"\n    expected: (");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
            poVar3 = std::operator<<(poVar3,") ");
            pcVar4 = (char *)exr_get_default_error_message(1);
            poVar3 = std::operator<<(poVar3,pcVar4);
            std::endl<char,std::char_traits<char>>(poVar3);
            core_test_fail("exr_attr_float_vector_create (f, &fv, fdata, 4)",(char *)0x201,0x1523e2,
                           pcVar5);
          }
          exr_finish(&f);
          return;
        }
        core_test_fail("fv.arr[3] == 4.f",(char *)0x1fd,0x1523e2,pcVar5);
      }
      core_test_fail("fv.arr[0] == 1.f",(char *)0x1fa,0x1523e2,pcVar5);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar5 = (char *)exr_get_default_error_message(iVar1);
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3,"\n    expected: (");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
  poVar3 = std::operator<<(poVar3,") ");
  pcVar5 = (char *)exr_get_default_error_message(3);
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  core_test_fail("exr_attr_float_vector_init (f, __null, 4)",(char *)0x1cb,0x1523e2,in_RCX);
}

Assistant:

void
testAttrFloatVectors (const std::string& tempdir)
{
    // we no longer allow a null context as we need the memory allocator
    //testFloatVectorHelper (NULL);
    exr_context_t f = createDummyFile ("<floatvector>");
    testFloatVectorHelper (f);
    exr_finish (&f);
}